

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcObjTemplate * __thiscall
CTcParser::find_class_template
          (CTcParser *this,CTPNSuperclass *first_sc,CTcObjTemplateInst *src,size_t src_cnt,
          CTPNSuperclass **def_sc,int *undesc_class)

{
  CTPNSuperclass *pCVar1;
  bool bVar2;
  int iVar3;
  CTcSymbol *pCVar4;
  CTcObjTemplate *pCVar5;
  CTcObjTemplate *tpl;
  CTcObjTemplate *pCVar6;
  CTPNSuperclass *cur_def_sc;
  CTPNSuperclass *local_38;
  
  if (first_sc == (CTPNSuperclass *)0x0) {
LAB_0023e15e:
    pCVar6 = (CTcObjTemplate *)0x0;
  }
  else {
    pCVar6 = (CTcObjTemplate *)0x0;
    do {
      pCVar4 = CTcPrsSymtab::find(this->global_symtab_,first_sc->sym_txt_,first_sc->sym_len_,
                                  (CTcPrsSymtab **)0x0);
      bVar2 = false;
      if (pCVar4 != (CTcSymbol *)0x0) {
        if ((*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                      field_0x24 == 2) &&
           ((int)pCVar4[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_ == 0)) {
          pCVar5 = *(CTcObjTemplate **)
                    &pCVar4[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                     field_0x20;
          while ((pCVar5 != (CTcObjTemplate *)0x0 &&
                 (iVar3 = match_template(this,*(CTcObjTemplateItem **)pCVar5,src,src_cnt),
                 iVar3 == 0))) {
            pCVar5 = *(CTcObjTemplate **)(pCVar5 + 0x10);
          }
          pCVar1 = first_sc;
          if (pCVar5 == (CTcObjTemplate *)0x0) {
            pCVar1 = (CTPNSuperclass *)
                     pCVar4[3].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                     _vptr_CVmHashEntry;
            if ((pCVar1 == (CTPNSuperclass *)0x0) &&
               ((pCVar4[4].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_ & 0x400)
                == 0)) {
              *undesc_class = 1;
            }
            else {
              pCVar5 = find_class_template(this,pCVar1,src,src_cnt,&local_38,undesc_class);
              pCVar1 = local_38;
              if (*undesc_class == 0) goto LAB_0023e0d6;
            }
            bVar2 = false;
          }
          else {
LAB_0023e0d6:
            local_38 = pCVar1;
            pCVar1 = local_38;
            bVar2 = true;
            if ((pCVar5 != (CTcObjTemplate *)0x0) &&
               ((pCVar6 == (CTcObjTemplate *)0x0 ||
                (iVar3 = CTPNSuperclass::is_subclass_of(local_38,*def_sc), iVar3 != 0)))) {
              *def_sc = pCVar1;
              pCVar6 = pCVar5;
              bVar2 = true;
            }
          }
        }
        else {
          bVar2 = false;
        }
      }
      if (!bVar2) goto LAB_0023e15e;
      first_sc = first_sc->nxt_;
    } while (first_sc != (CTPNSuperclass *)0x0);
  }
  return pCVar6;
}

Assistant:

const CTcObjTemplate *CTcParser::
   find_class_template(const CTPNSuperclass *first_sc,
                       CTcObjTemplateInst *src, size_t src_cnt,
                       const CTPNSuperclass **def_sc,
                       int *undesc_class)
{
    /* scan each superclass in the list for a match */
    const CTPNSuperclass *sc;
    const CTcObjTemplate *tpl;
    for (tpl = 0, sc = first_sc ; sc != 0 ; sc = sc->nxt_)
    {
        /* find the symbol for this superclass */
        CTcSymObj *sc_sym = (CTcSymObj *)get_global_symtab()->find(
            sc->get_sym_txt(), sc->get_sym_len());

        /* if there's no symbol, or it's not a tads-object, give up */
        if (sc_sym == 0
            || sc_sym->get_type() != TC_SYM_OBJ
            || sc_sym->get_metaclass() != TC_META_TADSOBJ)
        {
            /* 
             *   this class has an invalid superclass - just give up without
             *   issuing any errors now, since we'll have plenty to say
             *   about this when building the object file data 
             */
            return 0;
        }

        /* find a match in this superclass hierarchy */
        const CTcObjTemplate *cur_tpl = find_template_match(
            sc_sym->get_first_template(), src, src_cnt);

        /* see what we found */
        const CTPNSuperclass *cur_def_sc;
        if (cur_tpl != 0)
        {
            /* we found it - note the current defining superclass */
            cur_def_sc = sc;
        }
        else
        {
            /* 
             *   If this one has no superclass list, and it's not explicitly
             *   a subclass of the root class, then this is an undescribed
             *   class and cannot be used with templates at all.  A class is
             *   undescribed when it is explicitly declared as 'extern', and
             *   does not have a definition in any imported symbol file in
             *   the current compilation.  If this is the case, flag it so
             *   the caller will know we have an undescribed class.
             *   
             *   Note that we only set this flag if we failed to find a
             *   template.  A template can still be used if a matching
             *   template is explicitly defined on the class in this
             *   compilation unit, since in that case we don't need to look
             *   up the inheritance hierarchy for the class.  That's why we
             *   set the flag here, only after we have failed to find a
             *   template for the object.  
             */
            if (sc_sym->get_sc_name_head() == 0 && !sc_sym->sc_is_root())
            {
                /* tell the caller we have an undescribed class */
                *undesc_class = TRUE;

                /* 
                 *   there's no need to look any further, since any matches
                 *   we might find among our other superclasses would be in
                 *   doubt because of the lack of information about this
                 *   earlier class, which might override later superclasses
                 *   if we knew more about it 
                 */
                return 0;
            }

            /* we didn't find it - search superclasses of this class */
            cur_tpl = find_class_template(sc_sym->get_sc_name_head(),
                                          src, src_cnt, &cur_def_sc,
                                          undesc_class);

            /* 
             *   if we have an undescribed class among our superclasses,
             *   we're implicitly undescribed as well - if that's the case,
             *   there's no need to look any further, so return failure 
             */
            if (*undesc_class)
                return 0;
        }

        /* if we found a match, see if we want to keep it */
        if (cur_tpl != 0)
        {
            /* 
             *   if this is our first match, note it; if it's not, see if it
             *   overrides the previous match 
             */
            if (tpl == 0)
            {
                /* this is the first match - definitely keep it */
                tpl = cur_tpl;
                *def_sc = cur_def_sc;
            }
            else
            {
                /* 
                 *   if the current source object descends from the previous
                 *   source object, this definition overrides the previous
                 *   definition, so keep it rather than the last one 
                 */
                if (cur_def_sc->is_subclass_of(*def_sc))
                {
                    /* it overrides the previous one - keep the new one */
                    tpl = cur_tpl;
                    *def_sc = cur_def_sc;
                }
            }
        }
    }

    /* return the best match we found */
    return tpl;
}